

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharmmTorsionType.cpp
# Opt level: O2

void __thiscall
OpenMD::CharmmTorsionType::calcForce
          (CharmmTorsionType *this,RealType cosPhi,RealType *V,RealType *dVdCosPhi)

{
  DoublePolynomial *this_00;
  double dVar1;
  double dVar2;
  ulong extraout_XMM0_Qb;
  double dVar3;
  double local_40;
  double local_38;
  ulong uStack_30;
  
  if (cosPhi <= 1.0) {
    local_40 = cosPhi;
    if (cosPhi < -1.0) {
      local_40 = -1.0;
    }
  }
  else {
    local_40 = 1.0;
  }
  dVar3 = 1.0 - local_40 * local_40;
  uStack_30 = 0;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
    uStack_30 = extraout_XMM0_Qb;
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  local_38 = (double)(~-(ulong)(ABS(dVar3) < 1e-06) & (ulong)dVar3 |
                     ((ulong)dVar3 & 0x8000000000000000 | 0x3eb0c6f7a0b5ed8d) &
                     -(ulong)(ABS(dVar3) < 1e-06));
  uStack_30 = uStack_30 & (~(uStack_30 & 0x7fffffffffffffff) | 0x3eb0c6f7a0b5ed8d);
  dVar3 = this->C_;
  dVar1 = Polynomial<double>::evaluate(&this->T_,&local_40);
  this_00 = &this->U_;
  dVar2 = Polynomial<double>::evaluate(this_00,&local_40);
  *V = dVar2 * local_38 + dVar1 + dVar3;
  dVar3 = Polynomial<double>::evaluateDerivative(&this->T_,&local_40);
  *dVdCosPhi = dVar3;
  dVar3 = Polynomial<double>::evaluateDerivative(this_00,&local_40);
  *dVdCosPhi = dVar3 * local_38 + *dVdCosPhi;
  dVar3 = Polynomial<double>::evaluate(this_00,&local_40);
  *dVdCosPhi = dVar3 / (local_38 + local_38) + *dVdCosPhi;
  return;
}

Assistant:

void CharmmTorsionType::calcForce(RealType cosPhi, RealType& V,
                                    RealType& dVdCosPhi) {
    // check roundoff
    if (cosPhi > 1.0) {
      cosPhi = 1.0;
    } else if (cosPhi < -1.0) {
      cosPhi = -1.0;
    }

    RealType sinPhi = sqrt(1.0 - cosPhi * cosPhi);

    // trick to avoid divergence in angles near 0 and pi:

    if (fabs(sinPhi) < 1.0E-6) { sinPhi = copysign(1.0E-6, sinPhi); }

    V         = C_ + T_.evaluate(cosPhi) + U_.evaluate(cosPhi) * sinPhi;
    dVdCosPhi = T_.evaluateDerivative(cosPhi);
    // Chain rule for U * sinPhi term:
    dVdCosPhi += U_.evaluateDerivative(cosPhi) * sinPhi;
    dVdCosPhi += U_.evaluate(cosPhi) / (2.0 * sinPhi);
  }